

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cc
# Opt level: O2

Status __thiscall
leveldb::SetCurrentFile(leveldb *this,Env *env,string *dbname,uint64_t descriptor_number)

{
  pointer pcVar1;
  long lVar2;
  string tmp;
  string manifest;
  Status SStack_d8;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  Slice local_70;
  Slice local_60;
  string local_50;
  
  DescriptorFileName(&local_50,dbname,descriptor_number);
  lVar2 = dbname->_M_string_length + 1;
  local_60.size_ = local_50._M_string_length - lVar2;
  local_60.data_ = local_50._M_dataplus._M_p + lVar2;
  TempFileName(&local_d0,dbname,descriptor_number);
  Slice::ToString_abi_cxx11_(&local_b0,&local_60);
  std::operator+(&local_90,&local_b0,"\n");
  local_70.data_ = local_90._M_dataplus._M_p;
  local_70.size_ = local_90._M_string_length;
  WriteStringToFileSync(this,env,&local_70,&local_d0);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  if (*(long *)this == 0) {
    CurrentFileName(&local_90,dbname);
    (*env->_vptr_Env[0xc])(&local_b0,env,&local_d0,&local_90);
    pcVar1 = *(pointer *)this;
    *(pointer *)this = local_b0._M_dataplus._M_p;
    local_b0._M_dataplus._M_p = pcVar1;
    Status::~Status((Status *)&local_b0);
    std::__cxx11::string::_M_dispose();
    if (*(long *)this == 0) goto LAB_0010fd88;
  }
  (*env->_vptr_Env[8])(&SStack_d8,env,&local_d0);
  Status::~Status(&SStack_d8);
LAB_0010fd88:
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return (Status)(char *)this;
}

Assistant:

Status SetCurrentFile(Env* env, const std::string& dbname,
                      uint64_t descriptor_number) {
  // Remove leading "dbname/" and add newline to manifest file name
  std::string manifest = DescriptorFileName(dbname, descriptor_number);
  Slice contents = manifest;
  assert(contents.starts_with(dbname + "/"));
  contents.remove_prefix(dbname.size() + 1);
  std::string tmp = TempFileName(dbname, descriptor_number);
  Status s = WriteStringToFileSync(env, contents.ToString() + "\n", tmp);
  if (s.ok()) {
    s = env->RenameFile(tmp, CurrentFileName(dbname));
  }
  if (!s.ok()) {
    env->DeleteFile(tmp);
  }
  return s;
}